

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall
preprocessor_test_arguments_comma_Test::TestBody(preprocessor_test_arguments_comma_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *in_stack_fffffffffffffef0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  AssertionResult *this_01;
  AssertHelper local_b8;
  Message local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  AssertionResult local_a0;
  AssertHelper local_90;
  Message local_88;
  undefined4 local_80;
  undefined4 local_7c;
  AssertionResult local_78;
  AssertHelper local_68;
  Message local_60;
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 1;
  local_20 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (int *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e715);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10e772);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e7c7);
  local_54 = 1;
  local_58 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (int *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e86f);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x10e8cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e921);
  local_7c = 0;
  local_80 = 0;
  this_01 = &local_78;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffffff00,
             (int *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    in_stack_ffffffffffffff00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10e9c9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x24,in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x10ea26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ea7b);
  local_a4 = 0;
  local_a8 = 0;
  this_00 = &local_a0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffffff00,
             (int *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10eb0e);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message((Message *)0x10eb5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eba6);
  return;
}

Assistant:

TEST_F(preprocessor_test, arguments_comma)
{
	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_COMMA(1, 2, 3, 4, 5));

	EXPECT_EQ((int)1, (int)PREPROCESSOR_ARGS_COMMA(1, 2));

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COMMA(1));

	EXPECT_EQ((int)0, (int)PREPROCESSOR_ARGS_COMMA());
}